

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O2

FieldGenerator *
google::protobuf::compiler::cpp::FieldGeneratorMap::MakeGenerator
          (FieldDescriptor *field,Options *options)

{
  long lVar1;
  bool bVar2;
  CppType CVar3;
  MessageOneofFieldGenerator *this;
  
  if (*(int *)(field + 0x4c) == 3) {
    CVar3 = FieldDescriptor::cpp_type(field);
    if (CVar3 == CPPTYPE_ENUM) {
      this = (MessageOneofFieldGenerator *)operator_new(0x48);
      RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
                ((RepeatedEnumFieldGenerator *)this,field,options);
    }
    else if (CVar3 == CPPTYPE_STRING) {
      this = (MessageOneofFieldGenerator *)operator_new(0x48);
      RepeatedStringFieldGenerator::RepeatedStringFieldGenerator
                ((RepeatedStringFieldGenerator *)this,field,options);
    }
    else if (CVar3 == CPPTYPE_MESSAGE) {
      bVar2 = FieldDescriptor::is_map(field);
      this = (MessageOneofFieldGenerator *)operator_new(0x50);
      if (bVar2) {
        MapFieldGenerator::MapFieldGenerator((MapFieldGenerator *)this,field,options);
      }
      else {
        RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
                  ((RepeatedMessageFieldGenerator *)this,field,options);
      }
    }
    else {
      this = (MessageOneofFieldGenerator *)operator_new(0x48);
      RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
                ((RepeatedPrimitiveFieldGenerator *)this,field,options);
    }
  }
  else {
    lVar1 = *(long *)(field + 0x60);
    CVar3 = FieldDescriptor::cpp_type(field);
    if (lVar1 == 0) {
      if (CVar3 == CPPTYPE_ENUM) {
        this = (MessageOneofFieldGenerator *)operator_new(0x48);
        EnumFieldGenerator::EnumFieldGenerator((EnumFieldGenerator *)this,field,options);
      }
      else if (CVar3 == CPPTYPE_STRING) {
        this = (MessageOneofFieldGenerator *)operator_new(0x48);
        StringFieldGenerator::StringFieldGenerator((StringFieldGenerator *)this,field,options);
      }
      else if (CVar3 == CPPTYPE_MESSAGE) {
        this = (MessageOneofFieldGenerator *)operator_new(0x50);
        MessageFieldGenerator::MessageFieldGenerator((MessageFieldGenerator *)this,field,options);
      }
      else {
        this = (MessageOneofFieldGenerator *)operator_new(0x48);
        PrimitiveFieldGenerator::PrimitiveFieldGenerator
                  ((PrimitiveFieldGenerator *)this,field,options);
      }
    }
    else if (CVar3 == CPPTYPE_ENUM) {
      this = (MessageOneofFieldGenerator *)operator_new(0x48);
      EnumOneofFieldGenerator::EnumOneofFieldGenerator
                ((EnumOneofFieldGenerator *)this,field,options);
    }
    else if (CVar3 == CPPTYPE_STRING) {
      this = (MessageOneofFieldGenerator *)operator_new(0x50);
      StringOneofFieldGenerator::StringOneofFieldGenerator
                ((StringOneofFieldGenerator *)this,field,options);
    }
    else if (CVar3 == CPPTYPE_MESSAGE) {
      this = (MessageOneofFieldGenerator *)operator_new(0x58);
      MessageOneofFieldGenerator::MessageOneofFieldGenerator(this,field,options);
    }
    else {
      this = (MessageOneofFieldGenerator *)operator_new(0x48);
      PrimitiveOneofFieldGenerator::PrimitiveOneofFieldGenerator
                ((PrimitiveOneofFieldGenerator *)this,field,options);
    }
  }
  return (FieldGenerator *)this;
}

Assistant:

FieldGenerator* FieldGeneratorMap::MakeGenerator(const FieldDescriptor* field,
                                                 const Options& options) {
  if (field->is_repeated()) {
    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (field->is_map()) {
          return new MapFieldGenerator(field, options);
        } else {
          return new RepeatedMessageFieldGenerator(field, options);
        }
      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // RepeatedStringFieldGenerator handles unknown ctypes.
          case FieldOptions::STRING:
            return new RepeatedStringFieldGenerator(field, options);
        }
      case FieldDescriptor::CPPTYPE_ENUM:
        return new RepeatedEnumFieldGenerator(field, options);
      default:
        return new RepeatedPrimitiveFieldGenerator(field, options);
    }
  } else if (field->containing_oneof()) {
    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_MESSAGE:
        return new MessageOneofFieldGenerator(field, options);
      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // StringOneofFieldGenerator handles unknown ctypes.
          case FieldOptions::STRING:
            return new StringOneofFieldGenerator(field, options);
        }
      case FieldDescriptor::CPPTYPE_ENUM:
        return new EnumOneofFieldGenerator(field, options);
      default:
        return new PrimitiveOneofFieldGenerator(field, options);
    }
  } else {
    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_MESSAGE:
        return new MessageFieldGenerator(field, options);
      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // StringFieldGenerator handles unknown ctypes.
          case FieldOptions::STRING:
            return new StringFieldGenerator(field, options);
        }
      case FieldDescriptor::CPPTYPE_ENUM:
        return new EnumFieldGenerator(field, options);
      default:
        return new PrimitiveFieldGenerator(field, options);
    }
  }
}